

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O1

void next_entry(quicly_sentmap_iter_t *iter)

{
  size_t *psVar1;
  quicly_sent_t *pqVar2;
  st_quicly_sent_block_t *psVar3;
  quicly_sent_t *pqVar4;
  
  psVar1 = &iter->count;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    psVar3 = *iter->ref;
    iter->ref = &psVar3->next;
    psVar3 = psVar3->next;
    if (psVar3 == (st_quicly_sent_block_t *)0x0) {
      iter->p = &quicly_sentmap__end_iter;
      iter->count = 0;
      return;
    }
    if (psVar3->num_entries == 0) {
      __assert_fail("(*iter->ref)->num_entries != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                    ,0x26,"void next_entry(quicly_sentmap_iter_t *)");
    }
    iter->count = psVar3->num_entries;
    pqVar4 = psVar3->entries;
  }
  else {
    pqVar4 = iter->p + 1;
  }
  pqVar4 = pqVar4 + -1;
  do {
    pqVar2 = pqVar4 + 1;
    pqVar4 = pqVar4 + 1;
  } while (pqVar2->acked == (quicly_sent_acked_cb)0x0);
  iter->p = pqVar4;
  return;
}

Assistant:

static void next_entry(quicly_sentmap_iter_t *iter)
{
    if (--iter->count != 0) {
        ++iter->p;
    } else if (*(iter->ref = &(*iter->ref)->next) == NULL) {
        iter->p = (quicly_sent_t *)&quicly_sentmap__end_iter;
        iter->count = 0;
        return;
    } else {
        assert((*iter->ref)->num_entries != 0);
        iter->count = (*iter->ref)->num_entries;
        iter->p = (*iter->ref)->entries;
    }
    while (iter->p->acked == NULL)
        ++iter->p;
}